

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O0

SPxId __thiscall soplex::SPxSolverBase<double>::id(SPxSolverBase<double> *this,int i)

{
  Representation RVar1;
  SPxSolverBase<double> *in_RDI;
  SPxColId cid;
  SPxRowId rid;
  SPxRowId *in_stack_ffffffffffffffc8;
  int n;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined8 local_8;
  
  RVar1 = rep(in_RDI);
  n = (int)((ulong)in_RDI >> 0x20);
  if (RVar1 == ROW) {
    SPxLPBase<double>::rId
              ((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),n)
    ;
    SPxId::SPxId((SPxId *)in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    SPxLPBase<double>::cId
              ((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),n)
    ;
    SPxId::SPxId((SPxId *)in_RDI,(SPxColId *)in_stack_ffffffffffffffc8);
  }
  return (SPxId)local_8;
}

Assistant:

SPxId id(int i) const
   {
      if(rep() == ROW)
      {
         SPxRowId rid = SPxLPBase<R>::rId(i);
         return SPxId(rid);
      }
      else
      {
         SPxColId cid = SPxLPBase<R>::cId(i);
         return SPxId(cid);
      }
   }